

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

void initNames(void)

{
  uint32_t uVar1;
  uint32_t uVar2;
  reference pvVar3;
  uint local_14;
  int j;
  int length;
  int i;
  
  for (j = 0; j != 100000; j = j + 1) {
    uVar1 = rand32();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_guts::Allocator<char>_>::resize
              (names_abi_cxx11_ + j,(long)(int)(uVar1 & 0x1f));
    for (local_14 = 0; local_14 != (uVar1 & 0x1f); local_14 = local_14 + 1) {
      uVar2 = rand32();
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_guts::Allocator<char>_>::
               operator[](names_abi_cxx11_ + j,(long)(int)local_14);
      *pvVar3 = (char)((ulong)uVar2 % 0x1a) + 'A';
    }
  }
  return;
}

Assistant:

void initNames()
{
    for (int i = 0; i != INT_RANGE; ++i)
    {
        int length = rand32() % 32;
        names[i].resize(length);
        for (int j = 0; j != length; ++j)
        {
            names[i][j] = 'A' + (rand32() % 26);
        }
    }
}